

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

int __thiscall
CVmObjTads::getp_get_method(CVmObjTads *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_prop_id_t vVar1;
  int iVar2;
  uint uVar3;
  vm_datatype_t vVar4;
  vm_obj_id_t source_obj;
  tadsobj_sc_search_ctx curpos;
  
  if (getp_get_method(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar2 = __cxa_guard_acquire(&getp_get_method(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar2 != 0) {
      getp_get_method::desc.min_argc_ = 1;
      getp_get_method::desc.opt_argc_ = 0;
      getp_get_method::desc.varargs_ = 0;
      __cxa_guard_release(&getp_get_method(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_method::desc);
  if (iVar2 == 0) {
    vVar4 = VM_NIL;
    vVar1 = CVmBif::pop_propid_val();
    curpos.curhdr = (vm_tadsobj_hdr *)(this->super_CVmObject).ext_;
    curpos.path_sc = (tadsobj_objid_and_ptr *)0x0;
    curpos.cur = self;
    iVar2 = tadsobj_sc_search_ctx::find_prop(&curpos,(uint)vVar1,retval,&source_obj);
    if ((iVar2 != 0) && (uVar3 = retval->typ - VM_DSTRING, uVar3 < 10)) {
      vVar4 = *(vm_datatype_t *)(&DAT_002b4a54 + (ulong)uVar3 * 4);
    }
    retval->typ = vVar4;
  }
  return 1;
}

Assistant:

int CVmObjTads::getp_get_method(VMG_ vm_obj_id_t self,
                                vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(1);

    /* check arguments: getMethod(&propid) */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve the property ID */
    vm_obj_id_t prop = CVmBif::pop_propid_val(vmg0_);

    /* find the property */
    vm_obj_id_t source_obj;
    tadsobj_sc_search_ctx curpos(vmg_ self, this);
    if (curpos.find_prop(vmg_ prop, retval, &source_obj))
    {
        /* the property is definfed - check its type */
        switch (retval->typ)
        {
        case VM_CODEOFS:
            /* it's a direct call to code - convert to a function pointer */
            retval->typ = VM_FUNCPTR;
            break;

        case VM_DSTRING:
            /* it's a self-printing constant string - convert to string */
            retval->typ = VM_SSTRING;
            break;

        case VM_OBJX:
            /* 
             *   It's an executable object, which is either a self-printing
             *   non-constant string or an execute-on-invoke anonymous
             *   function.  In either case, simply convert it back to an
             *   ordinary value. 
             */
            retval->typ = VM_OBJ;
            break;

        case VM_BIFPTRX:
            /* 
             *   executable built-in function pointer - convert back to a
             *   regular bif pointer 
             */
            retval->typ = VM_BIFPTR;
            break;

        default:
            /* other types aren't executable methods, so return nil */
            retval->set_nil();
            break;
        }
    }
    else
    {
        /* this property isn't defined - return nil */
        retval->set_nil();
    }

    /* handled */
    return TRUE;
}